

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::dispose
          (ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this)

{
  FlattenedField *firstElement;
  RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *pRVar1;
  FlattenedField *pFVar2;
  FlattenedField *endCopy;
  FlattenedField *posCopy;
  FlattenedField *ptrCopy;
  ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pFVar2 = this->endPtr;
  if (firstElement != (FlattenedField *)0x0) {
    this->ptr = (FlattenedField *)0x0;
    this->pos = (RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)0x0;
    this->endPtr = (FlattenedField *)0x0;
    ArrayDisposer::dispose<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0xb8,
               ((long)pFVar2 - (long)firstElement) / 0xb8);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }